

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

_Bool oonf_layer2_net_remove(oonf_layer2_net *l2net,oonf_layer2_origin *origin)

{
  char *pcVar1;
  list_entity *plVar2;
  _Bool _Var3;
  bool bVar4;
  long lVar5;
  byte bVar6;
  list_entity *plVar7;
  
  if ((l2net->_node).list.next == (list_entity *)0x0) {
    return false;
  }
  if ((l2net->_node).list.prev != (list_entity *)0x0) {
    plVar7 = (l2net->neighbors).list_head.next;
    if (plVar7->prev == (l2net->neighbors).list_head.prev) {
      bVar6 = 0;
    }
    else {
      bVar6 = 0;
      do {
        plVar2 = plVar7->next;
        _Var3 = oonf_layer2_neigh_remove((oonf_layer2_neigh *)(plVar7 + -0x4c),origin);
        bVar6 = bVar6 | _Var3;
        plVar7 = plVar2;
      } while (plVar2->prev != (l2net->neighbors).list_head.prev);
    }
    lVar5 = 0x130;
    bVar4 = false;
    do {
      if (*(oonf_layer2_origin **)(l2net->name + lVar5) == origin) {
        pcVar1 = l2net->name + lVar5 + -8;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        bVar4 = true;
      }
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0x3b0);
    lVar5 = 0x3b0;
    do {
      if (*(oonf_layer2_origin **)(l2net->name + lVar5) == origin) {
        pcVar1 = l2net->name + lVar5 + -8;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        bVar4 = true;
      }
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0x7c0);
    if (bVar4 || bVar6 != 0) {
      oonf_layer2_net_commit(l2net);
      return true;
    }
  }
  return false;
}

Assistant:

static INLINE bool
list_is_node_added(const struct list_entity *node) {
  return node->next != NULL && node->prev != NULL;
}